

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool CountHighbitsCollisions<Blob<160>>
               (vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes,int nbHBits)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  size_t hnb;
  ulong uVar5;
  double dVar6;
  double dVar7;
  Blob<160> h2;
  Blob<160> h1;
  
  bVar1 = true;
  if (nbHBits < 0xa0) {
    uVar2 = ((long)(hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x14;
    dVar6 = EstimateNbCollisions((int)uVar2,nbHBits);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbHBits);
    uVar4 = 0;
    lVar3 = 0;
    for (uVar5 = 1; uVar5 < uVar2; uVar5 = uVar5 + 1) {
      Blob<160>::operator>>
                (&h1,(Blob<160> *)
                     (((hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                       super__Vector_impl_data._M_start)->bytes + lVar3),0xa0 - nbHBits);
      Blob<160>::operator>>
                (&h2,(Blob<160> *)
                     ((hashes->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
                      super__Vector_impl_data._M_start[1].bytes + lVar3),0xa0 - nbHBits);
      bVar1 = Blob<160>::operator==(&h1,&h2);
      uVar4 = uVar4 + bVar1;
      lVar3 = lVar3 + 0x14;
    }
    dVar7 = (double)(int)uVar4 / dVar6;
    printf("actual %6i (%.2fx)",(ulong)uVar4);
    if ((0.98 < dVar7) && (uVar4 - (int)dVar6 != 0)) {
      printf(" (%i)",(ulong)(uVar4 - (int)dVar6));
    }
    if (2.0 < dVar7) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar1 = 2.0 >= dVar7;
  }
  return bVar1;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = hashes[hnb-1];
    hashtype const h2x = hashes[hnb];
#endif
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}